

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeYMD(DateTime *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if (p->validYMD != '\0') {
    return;
  }
  if (p->validJD == '\0') {
    iVar1 = 1;
    iVar2 = 2000;
    iVar3 = iVar1;
  }
  else {
    iVar1 = (int)((p->iJD + 43200000) / 86400000);
    iVar2 = (int)(((double)iVar1 + -1867216.25) / 36524.25);
    iVar3 = iVar2 / -4;
    iVar1 = iVar1 + iVar2;
    iVar2 = (int)(((double)(iVar3 + iVar1 + 0x5f5) + -122.1) / 365.25);
    iVar1 = (iVar2 * 0x8ead) / -100 + iVar1 + iVar3 + 0x5f5;
    dVar4 = (double)iVar1 / 30.6001;
    iVar3 = (int)dVar4;
    iVar1 = iVar1 - (int)((double)(int)dVar4 * 30.6001);
    iVar3 = (-(uint)(iVar3 < 0xe) | 0xfffffff3) + iVar3;
    iVar2 = (2 < iVar3 ^ 0xffffed95) + iVar2;
  }
  p->Y = iVar2;
  p->M = iVar3;
  p->D = iVar1;
  p->validYMD = '\x01';
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else{
    Z = (int)((p->iJD + 43200000)/86400000);
    A = (int)((Z - 1867216.25)/36524.25);
    A = Z + 1 + A - (A/4);
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*C)/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}